

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJs.cpp
# Opt level: O1

void Js::AsmJSCompiler::VOutputMessage
               (ScriptContext *scriptContext,DEBUG_EVENT_INFO_TYPE messageType,wchar *message,
               __va_list_tag *argptr)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  int iVar4;
  char16_t local_1028 [4];
  char16 buf [2048];
  
  iVar2 = _vsnwprintf(local_1028,0x800,message,argptr);
  buf[0x7fb] = L'\0';
  if ((iVar2 < 0) && (piVar3 = PAL_errno(0), *piVar3 == 0)) {
    piVar3 = PAL_errno(0);
    *piVar3 = 0x22;
  }
  iVar4 = 0x7ff;
  if (iVar2 != -1) {
    iVar4 = iVar2;
  }
  if (scriptContext->raiseMessageToDebuggerFunctionType != (RaiseMessageToDebuggerFunctionType)0x0)
  {
    (*scriptContext->raiseMessageToDebuggerFunctionType)
              (scriptContext,messageType,local_1028,scriptContext->url);
  }
  bVar1 = Phases::IsEnabled((Phases *)&DAT_015cd718,AsmjsPhase);
  if ((!bVar1) && (bVar1 = Phases::IsEnabled((Phases *)&DAT_015d3490,AsmjsPhase), !bVar1)) {
    return;
  }
  Output::PrintBuffer(local_1028,(long)iVar4);
  Output::Print(L"\n");
  Output::Flush();
  return;
}

Assistant:

void AsmJSCompiler::VOutputMessage(ScriptContext * scriptContext, const DEBUG_EVENT_INFO_TYPE messageType, const wchar * message, va_list argptr)
    {
        char16 buf[2048];
        size_t size;

        size = _vsnwprintf_s(buf, _countof(buf), _TRUNCATE, message, argptr);
        if (size == -1)
        {
            size = _countof(buf) - 1;  // characters written, excluding the terminating null
        }
#ifdef ENABLE_SCRIPT_DEBUGGING
        scriptContext->RaiseMessageToDebugger(messageType, buf, scriptContext->GetUrl());
#endif
        if (PHASE_TRACE1(AsmjsPhase) || PHASE_TESTTRACE1(AsmjsPhase))
        {
            Output::PrintBuffer(buf, size);
            Output::Print(_u("\n"));
            Output::Flush();
        }
    }